

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O2

__pid_t __thiscall kmp_flag_64::wait(kmp_flag_64 *this,void *__stat_loc)

{
  kmp_int32 kVar1;
  int iVar2;
  unsigned_long_long *puVar3;
  kmp_pause_status_t kVar4;
  ulong uVar5;
  undefined1 *puVar6;
  void *in_RCX;
  int in_EDX;
  long lVar7;
  int iVar8;
  bool bVar9;
  kmp_uint32 local_68;
  ulong local_58;
  ompt_state_t local_4c;
  int local_48 [2];
  ompt_data_t *local_40;
  void *local_38;
  
  kVar4 = __kmp_pause_status;
  puVar3 = (this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc;
  local_38 = in_RCX;
  if (in_EDX == 0) {
    local_48[1] = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar1 = *(kmp_int32 *)((long)__stat_loc + 0x24);
      local_68 = __kmp_yield_init;
      if ((__kmp_pause_status == kmp_soft_paused || __kmp_dflt_blocktime != 0x7fffffff) &&
         (local_58 = __kmp_hardware_timestamp(), kVar4 != kmp_soft_paused)) {
        local_58 = local_58 + *(long *)((long)__stat_loc + 0x88);
      }
      iVar8 = 0;
LAB_00142501:
      if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc !=
          (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_00142562:
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)__stat_loc + 0x1a8);
          if (lVar7 == 0) {
            *(undefined4 *)((long)__stat_loc + 0x1d0) = 1;
            goto LAB_00142562;
          }
          if (*(int *)(lVar7 + 0xc0) == 0) {
            *(undefined8 *)((long)__stat_loc + 0x1a8) = 0;
LAB_0014256f:
            *(undefined4 *)((long)__stat_loc + 0x1d0) = 1;
          }
          else {
            if (*(int *)(lVar7 + 0x50) != 1) goto LAB_0014256f;
            __kmp_execute_tasks_64((kmp_info_t *)__stat_loc,kVar1,this,0,local_48 + 1,local_38,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar8 < __kmp_itt_prepare_delay)) &&
           (iVar8 = iVar8 + 1, __kmp_itt_prepare_delay <= iVar8)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar3);
        }
        if (__kmp_global.g.g_done == 0) goto code_r0x001425b2;
        goto LAB_001426d6;
      }
LAB_001426e1:
      if (((ompt_enabled._0_1_ & 1) != 0) && (*(int *)((long)__stat_loc + 0x160) == 0x100)) {
        *(undefined4 *)((long)__stat_loc + 0x160) = 0x101;
      }
      bVar9 = SBORROW4(iVar8,__kmp_itt_prepare_delay);
      iVar8 = iVar8 - __kmp_itt_prepare_delay;
      goto LAB_001429e1;
    }
  }
  else {
    local_48[0] = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar1 = *(kmp_int32 *)((long)__stat_loc + 0x24);
      *(undefined1 *)((long)__stat_loc + 0x548) = 1;
      if ((ompt_enabled._0_1_ & 1) != 0) {
        local_4c = *(ompt_state_t *)((long)__stat_loc + 0x160);
        if ((local_4c == ompt_state_wait_barrier_implicit) &&
           (*(int *)((long)__stat_loc + 0x20) != 0)) {
          local_40 = (ompt_data_t *)((long)__stat_loc + 0x150);
        }
        else {
          lVar7 = *(long *)(*(long *)((long)__stat_loc + 0x40) + 0x230);
          if (lVar7 == 0) {
            local_40 = (ompt_data_t *)(*(long *)((long)__stat_loc + 0x1b0) + 0xf8);
          }
          else {
            local_40 = (ompt_data_t *)(lVar7 + 0x28);
          }
        }
        if ((__kmp_tasking_mode == tskm_immediate_exec) ||
           (*(long *)((long)__stat_loc + 0x1a8) == 0)) {
          __ompt_implicit_task_end((kmp_info_t *)__stat_loc,local_4c,local_40);
        }
      }
      kVar4 = __kmp_pause_status;
      local_68 = __kmp_yield_init;
      if ((__kmp_pause_status == kmp_soft_paused || __kmp_dflt_blocktime != 0x7fffffff) &&
         (local_58 = __kmp_hardware_timestamp(), kVar4 != kmp_soft_paused)) {
        local_58 = local_58 + *(long *)((long)__stat_loc + 0x88);
      }
      iVar8 = 0;
LAB_001427b2:
      if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc !=
          (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
        if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_00142811:
          lVar7 = 0;
        }
        else {
          lVar7 = *(long *)((long)__stat_loc + 0x1a8);
          if (lVar7 == 0) {
            *(undefined4 *)((long)__stat_loc + 0x1d0) = 1;
            goto LAB_00142811;
          }
          if (*(int *)(lVar7 + 0xc0) == 0) {
            if ((ompt_enabled._0_1_ & 1) != 0) {
              __ompt_implicit_task_end((kmp_info_t *)__stat_loc,local_4c,local_40);
            }
            *(undefined8 *)((long)__stat_loc + 0x1a8) = 0;
LAB_0014283a:
            *(undefined4 *)((long)__stat_loc + 0x1d0) = 1;
          }
          else {
            if (*(int *)(lVar7 + 0x50) != 1) goto LAB_0014283a;
            __kmp_execute_tasks_64((kmp_info_t *)__stat_loc,kVar1,this,1,local_48,local_38,0);
          }
        }
        if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
            (iVar8 < __kmp_itt_prepare_delay)) &&
           (iVar8 = iVar8 + 1, __kmp_itt_prepare_delay <= iVar8)) {
          (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar3);
        }
        if (__kmp_global.g.g_done == 0) goto code_r0x0014287d;
        goto LAB_0014297a;
      }
LAB_00142985:
      if (((*(ompt_state_t *)((long)__stat_loc + 0x160) != ompt_state_undefined & ompt_enabled._0_1_
           ) == 1) &&
         (__ompt_implicit_task_end
                    ((kmp_info_t *)__stat_loc,*(ompt_state_t *)((long)__stat_loc + 0x160),local_40),
         *(int *)((long)__stat_loc + 0x160) == 0x100)) {
        *(undefined4 *)((long)__stat_loc + 0x160) = 0x101;
      }
      *(undefined1 *)((long)__stat_loc + 0x548) = 0;
      bVar9 = SBORROW4(iVar8,__kmp_itt_prepare_delay);
      iVar8 = iVar8 - __kmp_itt_prepare_delay;
LAB_001429e1:
      bVar9 = bVar9 == iVar8 < 0;
      goto LAB_001429e4;
    }
  }
  bVar9 = __kmp_itt_prepare_delay < 1;
LAB_001429e4:
  puVar6 = __kmp_itt_fsync_acquired_ptr__3_0;
  if ((bool)(__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 & bVar9)) {
    puVar6 = (undefined1 *)(*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar3);
  }
  return (__pid_t)puVar6;
code_r0x001425b2:
  if (__kmp_use_yield - 1U < 2) {
    iVar2 = __kmp_avail_proc;
    if (__kmp_avail_proc == 0) {
      iVar2 = __kmp_xproc;
    }
    if (iVar2 < __kmp_nth) {
      __kmp_yield();
    }
    else if ((__kmp_use_yield == 1) && (local_68 = local_68 - 2, local_68 == 0)) {
      __kmp_yield();
      local_68 = __kmp_yield_next;
    }
  }
  if (((((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
       ((lVar7 == 0 || (*(int *)(lVar7 + 0x50) == 0)))) &&
      (uVar5 = __kmp_hardware_timestamp(), local_58 <= uVar5)) &&
     ((__kmp_dflt_blocktime != 0x7fffffff || (__kmp_pause_status == kmp_soft_paused)))) {
    __kmp_suspend_64(kVar1,this);
    if (__kmp_global.g.g_done != 0) {
LAB_001426d6:
      if (__kmp_global.g.g_abort != 0) {
        __kmp_abort_thread();
      }
      goto LAB_001426e1;
    }
    if ((__kmp_tasking_mode != tskm_immediate_exec) && (*(int *)((long)__stat_loc + 0x1d0) == 1)) {
      *(undefined4 *)((long)__stat_loc + 0x1d0) = 0;
    }
  }
  goto LAB_00142501;
code_r0x0014287d:
  if (__kmp_use_yield - 1U < 2) {
    iVar2 = __kmp_avail_proc;
    if (__kmp_avail_proc == 0) {
      iVar2 = __kmp_xproc;
    }
    if (iVar2 < __kmp_nth) {
      __kmp_yield();
    }
    else if ((__kmp_use_yield == 1) && (local_68 = local_68 - 2, local_68 == 0)) {
      __kmp_yield();
      local_68 = __kmp_yield_next;
    }
  }
  if ((((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
      ((lVar7 == 0 || (*(int *)(lVar7 + 0x50) == 0)))) &&
     ((uVar5 = __kmp_hardware_timestamp(), local_58 <= uVar5 &&
      ((__kmp_dflt_blocktime != 0x7fffffff || (__kmp_pause_status == kmp_soft_paused)))))) {
    *(undefined1 *)((long)__stat_loc + 0x548) = 0;
    __kmp_suspend_64(kVar1,this);
    *(undefined1 *)((long)__stat_loc + 0x548) = 1;
    if (__kmp_global.g.g_done != 0) {
LAB_0014297a:
      if (__kmp_global.g.g_abort != 0) {
        __kmp_abort_thread();
      }
      goto LAB_00142985;
    }
    if ((__kmp_tasking_mode != tskm_immediate_exec) && (*(int *)((long)__stat_loc + 0x1d0) == 1)) {
      *(undefined4 *)((long)__stat_loc + 0x1d0) = 0;
    }
  }
  goto LAB_001427b2;
}

Assistant:

void wait(kmp_info_t *this_thr,
            int final_spin USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    if (final_spin)
      __kmp_wait_template<kmp_flag_64, TRUE>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    else
      __kmp_wait_template<kmp_flag_64, FALSE>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
  }